

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.cpp
# Opt level: O2

Data * Integer::plus(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  pointer ppDVar1;
  pointer ppDVar2;
  Integer *this;
  long lVar3;
  int i;
  ulong uVar4;
  long local_38;
  
  this = (Integer *)operator_new(0x18);
  local_38 = 0;
  Integer(this,&local_38);
  ppDVar1 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppDVar2 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (uVar4 = 0; uVar4 < (ulong)((long)ppDVar2 - (long)ppDVar1 >> 3); uVar4 = uVar4 + 1) {
    lVar3 = __dynamic_cast(ppDVar1[uVar4],&Data::typeinfo,&typeinfo,0);
    this->value = this->value + *(long *)(lVar3 + 0x10);
  }
  return &this->super_Data;
}

Assistant:

Data *Integer::plus(std::vector<Data *> *dataPara) {
    auto result = new Integer(0);
    for (int i = 0; i < dataPara->size(); i++) {
        result->value += (dynamic_cast<Integer *>((*dataPara)[i]))->value;
    }
    return result;
}